

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.h
# Opt level: O0

bool __thiscall
Clasp::ShortImplicationsGraph::forEach<Clasp::Cli::WriteCnf>
          (ShortImplicationsGraph *this,Literal p,WriteCnf *op)

{
  bool bVar1;
  uint32 n;
  __pointer_type this_00;
  WriteCnf *this_01;
  WriteCnf *pWVar2;
  Block *in_RDX;
  uint32 in_ESI;
  left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_> *in_RDI;
  const_iterator endOf;
  const_iterator imp;
  bool r;
  Block *b;
  const_right_iterator it_1;
  const_left_iterator end;
  const_left_iterator it;
  const_right_iterator rEnd;
  ImplicationList *x;
  left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>
  *in_stack_ffffffffffffff58;
  Block *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  Literal in_stack_ffffffffffffff80;
  Literal in_stack_ffffffffffffff84;
  WriteCnf *in_stack_ffffffffffffff90;
  Literal in_stack_ffffffffffffff9c;
  undefined8 in_stack_ffffffffffffffa0;
  reverse_iterator<const_std::pair<Clasp::Literal,_Clasp::Literal>_*> local_48;
  uint32 local_40;
  uint32 local_3c;
  const_left_iterator local_38;
  const_left_iterator local_30;
  const_reference local_20;
  Block *local_18;
  Literal local_8 [2];
  
  local_18 = in_RDX;
  local_8[0].rep_ = in_ESI;
  n = Literal::id(local_8);
  local_20 = bk_lib::
             pod_vector<Clasp::ShortImplicationsGraph::ImplicationList,_std::allocator<Clasp::ShortImplicationsGraph::ImplicationList>_>
             ::operator[]((pod_vector<Clasp::ShortImplicationsGraph::ImplicationList,_std::allocator<Clasp::ShortImplicationsGraph::ImplicationList>_>
                           *)in_RDI,n);
  bVar1 = ImplicationList::empty((ImplicationList *)in_stack_ffffffffffffff60);
  if (!bVar1) {
    bk_lib::detail::left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>::
    right_end(in_stack_ffffffffffffff58);
    local_30 = bk_lib::detail::
               left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>::
               left_begin((left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>
                           *)0x11c0fe);
    local_38 = bk_lib::detail::
               left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>::left_end
                         ((left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>
                           *)local_20);
    for (; local_30 != local_38; local_30 = local_30 + 1) {
      local_3c = local_8[0].rep_;
      local_40 = local_30->rep_;
      bVar1 = Cli::WriteCnf::unary
                        ((WriteCnf *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                         in_stack_ffffffffffffff84,in_stack_ffffffffffffff80);
      if (!bVar1) {
        return false;
      }
    }
    bk_lib::detail::left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>::
    right_begin(in_RDI);
    while (bVar1 = std::operator!=((reverse_iterator<const_std::pair<Clasp::Literal,_Clasp::Literal>_*>
                                    *)in_stack_ffffffffffffff60,
                                   (reverse_iterator<const_std::pair<Clasp::Literal,_Clasp::Literal>_*>
                                    *)in_stack_ffffffffffffff58), bVar1) {
      in_stack_ffffffffffffff60 = local_18;
      std::reverse_iterator<const_std::pair<Clasp::Literal,_Clasp::Literal>_*>::operator->
                ((reverse_iterator<const_std::pair<Clasp::Literal,_Clasp::Literal>_*> *)local_18);
      std::reverse_iterator<const_std::pair<Clasp::Literal,_Clasp::Literal>_*>::operator->
                ((reverse_iterator<const_std::pair<Clasp::Literal,_Clasp::Literal>_*> *)
                 in_stack_ffffffffffffff60);
      bVar1 = Cli::WriteCnf::binary
                        (in_stack_ffffffffffffff90,
                         (Literal)(uint32)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                         (Literal)(uint32)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      if (!bVar1) {
        return false;
      }
      std::reverse_iterator<const_std::pair<Clasp::Literal,_Clasp::Literal>_*>::operator++
                (&local_48);
    }
    this_00 = std::atomic::operator_cast_to_Block_
                        ((atomic<Clasp::ShortImplicationsGraph::Block_*> *)0x11c21b);
    while (this_00 != (__pointer_type)0x0) {
      Literal::flag(local_8);
      in_stack_ffffffffffffff9c.rep_ = CONCAT13(1,(int3)in_stack_ffffffffffffff9c.rep_);
      this_01 = (WriteCnf *)Block::begin(this_00);
      pWVar2 = (WriteCnf *)Block::end(in_stack_ffffffffffffff60);
      while (this_01 != pWVar2) {
        bVar1 = Literal::flagged((Literal *)this_01);
        if (bVar1) {
          bVar1 = Cli::WriteCnf::unary
                            ((WriteCnf *)CONCAT44(in_stack_ffffffffffffff7c,local_8[0].rep_),
                             in_stack_ffffffffffffff84,in_stack_ffffffffffffff80);
          in_stack_ffffffffffffff9c.rep_ = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff9c.rep_);
          this_01 = (WriteCnf *)((long)&this_01->str_ + 4);
        }
        else {
          in_stack_ffffffffffffff80.rep_ = *(uint32 *)&this_01->str_;
          in_stack_ffffffffffffff7c = *(undefined4 *)((long)&this_01->str_ + 4);
          in_stack_ffffffffffffff84.rep_ = local_8[0].rep_;
          bVar1 = Cli::WriteCnf::binary
                            (this_01,(Literal)(uint32)((ulong)this_00 >> 0x20),
                             (Literal)(uint32)this_00,in_stack_ffffffffffffff9c);
          in_stack_ffffffffffffff9c.rep_ = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff9c.rep_);
          this_01 = (WriteCnf *)&this_01->lits_;
        }
        if ((char)(in_stack_ffffffffffffff9c.rep_ >> 0x18) == '\0') {
          return false;
        }
      }
      this_00 = std::atomic::operator_cast_to_Block_
                          ((atomic<Clasp::ShortImplicationsGraph::Block_*> *)0x11c32c);
    }
  }
  return true;
}

Assistant:

bool forEach(Literal p, const OP& op) const {
		const ImplicationList& x = graph_[p.id()];
		if (x.empty()) return true;
		ImplicationList::const_right_iterator rEnd = x.right_end(); // prefetch
		for (ImplicationList::const_left_iterator it = x.left_begin(), end = x.left_end(); it != end; ++it) {
			if (!op.unary(p, *it)) { return false; }
		}
		for (ImplicationList::const_right_iterator it = x.right_begin(); it != rEnd; ++it) {
			if (!op.binary(p, it->first, it->second)) { return false; }
		}
#if CLASP_HAS_THREADS
		for (Block* b = (x).learnt; b ; b = b->next) {
			p.flag(); bool r = true;
			for (Block::const_iterator imp = b->begin(), endOf = b->end(); imp != endOf; ) {
				if (!imp->flagged()) { r = op.binary(p, imp[0], imp[1]); imp += 2; }
				else                 { r = op.unary(p, imp[0]);          imp += 1; }
				if (!r)              { return false; }
			}
		}
#endif
		return true;
	}